

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

int Gia_ManPerformGlaOld(Gia_Man_t *pAig,Abs_Par_t *pPars,int fStartVta)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  sat_solver2 *s;
  long lVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  Abs_Par_t *p_00;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  abctime aVar19;
  Gia_Obj_t *pGVar20;
  Abc_Cex_t *pAVar21;
  Vec_Int_t *pVVar22;
  abctime aVar23;
  Prf_Man_t *pPVar24;
  char *pcVar25;
  Abc_Frame_t *pAbc;
  abctime aVar26;
  abctime aVar27;
  double local_5a8;
  double local_590;
  double local_578;
  double local_560;
  double local_548;
  double local_530;
  char *local_518;
  char local_488 [8];
  char Command [1000];
  int nConflsBeg;
  int nDumpOld;
  int nTimeOutOld;
  int nFramesStartOld;
  int nFramesMaxOld;
  abctime clk;
  abctime clk2;
  int RetValue;
  int fOneIsSent;
  int nCoreSize;
  int nVarsOld;
  int Status;
  int nConfls;
  int iPrev;
  int i;
  int f;
  Abc_Cex_t *pCex;
  Vec_Int_t *vCore;
  Vec_Int_t *vPPis;
  Gla_Man_t *p;
  Abs_Par_t *pAStack_20;
  int fStartVta_local;
  Abs_Par_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  _i = (Abc_Cex_t *)0x0;
  fOneIsSent = 0;
  bVar13 = false;
  clk2._4_4_ = -1;
  p._4_4_ = fStartVta;
  pAStack_20 = pPars;
  pPars_local = (Abs_Par_t *)pAig;
  aVar19 = Abc_Clock();
  iVar14 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
  if (iVar14 != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x670,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  if ((pAStack_20->nFramesMax != 0) && (pAStack_20->nFramesMax < pAStack_20->nFramesStart)) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x671,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  pGVar20 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
  pGVar20 = Gia_ObjFanin0(pGVar20);
  iVar14 = Gia_ObjIsConst0(pGVar20);
  if (iVar14 != 0) {
    pGVar20 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
    iVar14 = Gia_ObjFaninC0(pGVar20);
    if (iVar14 == 0) {
      printf("Sequential miter is trivially UNSAT.\n");
      return 1;
    }
    lVar1._0_4_ = pPars_local[2].fNewRefine;
    lVar1._4_4_ = pPars_local[2].fUseSkip;
    if (lVar1 != 0) {
      free(*(void **)&pPars_local[2].fNewRefine);
      pPars_local[2].fNewRefine = 0;
      pPars_local[2].fUseSkip = 0;
    }
    iVar14 = Gia_ManRegNum((Gia_Man_t *)pPars_local);
    iVar15 = Gia_ManPiNum((Gia_Man_t *)pPars_local);
    pAVar21 = Abc_CexMakeTriv(iVar14,iVar15,1,0);
    *(Abc_Cex_t **)&pPars_local[2].fNewRefine = pAVar21;
    printf("Sequential miter is trivially SAT.\n");
    return 0;
  }
  lVar2._0_4_ = pPars_local[2].fVerbose;
  lVar2._4_4_ = pPars_local[2].fVeryVerbose;
  if (lVar2 == 0) {
    if (p._4_4_ == 0) {
      iVar14 = Gia_ManObjNum((Gia_Man_t *)pPars_local);
      pVVar22 = Vec_IntStart(iVar14);
      *(Vec_Int_t **)&pPars_local[2].fVerbose = pVVar22;
      Vec_IntWriteEntry(*(Vec_Int_t **)&pPars_local[2].fVerbose,0,1);
      p_00 = pPars_local;
      pVVar22 = *(Vec_Int_t **)&pPars_local[2].fVerbose;
      pGVar20 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
      iVar14 = Gia_ObjFaninId0p((Gia_Man_t *)p_00,pGVar20);
      Vec_IntWriteEntry(pVVar22,iVar14,1);
    }
    else {
      iVar14 = pAStack_20->nFramesMax;
      iVar15 = pAStack_20->nFramesStart;
      iVar17 = pAStack_20->nTimeOut;
      iVar18 = pAStack_20->fDumpVabs;
      pAStack_20->nFramesMax = pAStack_20->nFramesStart;
      iVar16 = Abc_MinInt(pAStack_20->nFramesStart / 2 + 1,3);
      pAStack_20->nFramesStart = iVar16;
      pAStack_20->nTimeOut = 0x14;
      pAStack_20->fDumpVabs = 0;
      clk2._4_4_ = Gia_VtaPerformInt((Gia_Man_t *)pPars_local,pAStack_20);
      pAStack_20->nFramesMax = iVar14;
      pAStack_20->nFramesStart = iVar15;
      pAStack_20->nTimeOut = iVar17;
      pAStack_20->fDumpVabs = iVar18;
      Vec_IntFreeP((Vec_Int_t **)&pPars_local[2].fVerbose);
      lVar3._0_4_ = pPars_local[2].iFrame;
      lVar3._4_4_ = pPars_local[2].iFrameProved;
      if (lVar3 != 0) {
        pVVar22 = Gia_VtaConvertToGla((Gia_Man_t *)pPars_local,*(Vec_Int_t **)&pPars_local[2].iFrame
                                     );
        *(Vec_Int_t **)&pPars_local[2].fVerbose = pVVar22;
      }
      Vec_IntFreeP((Vec_Int_t **)&pPars_local[2].iFrame);
      if (clk2._4_4_ == 0) {
        return 0;
      }
      lVar4._0_4_ = pPars_local[2].fVerbose;
      lVar4._4_4_ = pPars_local[2].fVeryVerbose;
      if (lVar4 == 0) {
        return clk2._4_4_;
      }
    }
  }
  vPPis = (Vec_Int_t *)Gla_ManStart((Gia_Man_t *)pPars_local,pAStack_20);
  aVar23 = Abc_Clock();
  vPPis[10].pArray = (int *)(aVar23 - aVar19);
  if (*(int *)(*(long *)(vPPis + 1) + 0x20) != 0) {
    s = (sat_solver2 *)vPPis[5].pArray;
    iVar14 = *(int *)(*(long *)(vPPis + 1) + 0x20);
    aVar23 = Abc_Clock();
    sat_solver2_set_runtime_limit(s,(long)iVar14 * 1000000 + aVar23);
  }
  if (*(int *)(*(long *)(vPPis + 1) + 0x70) != 0) {
    Abc_Print(1,"Running gate-level abstraction (GLA) with the following parameters:\n");
    Abc_Print(1,"FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n",
              (ulong)(uint)pAStack_20->nFramesMax,(ulong)(uint)pAStack_20->nConfLimit,
              (ulong)(uint)pAStack_20->nTimeOut,(ulong)(uint)pAStack_20->nRatioMin);
    Abc_Print(1,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
              (ulong)(uint)pAStack_20->nLearnedStart,(ulong)(uint)pAStack_20->nLearnedDelta,
              (ulong)(uint)pAStack_20->nLearnedPerce);
    Abc_Print(1,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
  }
  nConfls = 0;
  iPrev = 0;
LAB_0073400d:
  bVar12 = true;
  if (**(int **)(vPPis + 1) != 0) {
    bVar12 = iPrev < **(int **)(vPPis + 1);
  }
  Status = nConfls;
  if (bVar12) {
    iVar14 = sat_solver2_nconflicts((sat_solver2 *)vPPis[5].pArray);
    *(int *)(*(long *)(vPPis + 1) + 0x78) = iPrev;
    Gia_GlaAddTimeFrame((Gla_Man_t *)vPPis,iPrev);
    nConfls = 0;
    do {
      aVar23 = Abc_Clock();
      pCex = (Abc_Cex_t *)
             Gla_ManUnsatCore((Gla_Man_t *)vPPis,iPrev,(sat_solver2 *)vPPis[5].pArray,
                              pAStack_20->nConfLimit,pAStack_20->fVerbose,&nCoreSize,&nVarsOld);
      if ((nCoreSize == -1) ||
         ((*(long *)(vPPis[5].pArray + 0x98) != 0 &&
          (aVar26 = Abc_Clock(), *(long *)(vPPis[5].pArray + 0x98) < aVar26)))) {
        Prf_ManStopP((Prf_Man_t **)(vPPis[5].pArray + 0x7a));
        break;
      }
      if (nCoreSize == 1) {
        Prf_ManStopP((Prf_Man_t **)(vPPis[5].pArray + 0x7a));
        aVar26 = Abc_Clock();
        vPPis[0xb].pArray = (int *)((aVar26 - aVar23) + (long)vPPis[0xb].pArray);
        goto LAB_007344b9;
      }
      aVar26 = Abc_Clock();
      *(abctime *)(vPPis + 0xb) = (aVar26 - aVar23) + *(long *)(vPPis + 0xb);
      if (nCoreSize != 0) {
        __assert_fail("Status == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x6cd,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      vPPis[4].nCap = vPPis[4].nCap + 1;
      iVar15 = Abc_FrameIsBridgeMode();
      if ((iVar15 != 0) && (bVar13)) {
        Gia_GlaSendCancel((Gla_Man_t *)vPPis,pAStack_20->fVerbose);
        bVar13 = false;
      }
      Abc_Clock();
      if (pAStack_20->fAddLayer == 0) {
        vCore = Gla_ManRefinement((Gla_Man_t *)vPPis);
        if (vCore == (Vec_Int_t *)0x0) goto code_r0x007341f0;
      }
      else {
        vCore = Gla_ManCollectPPis((Gla_Man_t *)vPPis,(Vec_Int_t *)0x0);
      }
      if (_i != (Abc_Cex_t *)0x0) {
        __assert_fail("pCex == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x6e8,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      if (nConfls == 0) {
        sat_solver2_bookmark((sat_solver2 *)vPPis[5].pArray);
        Vec_IntClear((Vec_Int_t *)vPPis[6].pArray);
        iVar15 = Vec_IntSize((Vec_Int_t *)vPPis[1].pArray);
        *(int *)((long)&vPPis[3].pArray + 4) = iVar15;
        fOneIsSent = *(int *)&vPPis[4].pArray;
        if (*(long *)(vPPis[5].pArray + 0x7a) != 0) {
          __assert_fail("p->pSat->pPrf2 == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x6f7,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
        }
        if (*(long *)(vPPis[5].pArray + 0x72) == 0) {
          pPVar24 = Prf_ManAlloc();
          *(Prf_Man_t **)(vPPis[5].pArray + 0x7a) = pPVar24;
        }
        if (*(long *)(vPPis[5].pArray + 0x7a) != 0) {
          *(undefined4 *)&vPPis[8].pArray = 0;
          pVVar22 = *(Vec_Int_t **)(vPPis + 8);
          iVar15 = Gia_ManObjNum((Gia_Man_t *)vPPis->pArray);
          Vec_IntFill(pVVar22,iVar15,-1);
          pPVar24 = *(Prf_Man_t **)(vPPis[5].pArray + 0x7a);
          pVVar22 = *(Vec_Int_t **)(vPPis + 8);
          iVar15 = sat_solver2_nlearnts((sat_solver2 *)vPPis[5].pArray);
          iVar17 = Vec_IntSize(vCore);
          Prf_ManRestart(pPVar24,pVVar22,iVar15,iVar17);
        }
      }
      else if (*(long *)(vPPis[5].pArray + 0x7a) != 0) {
        pPVar24 = *(Prf_Man_t **)(vPPis[5].pArray + 0x7a);
        iVar15 = *(int *)&vPPis[8].pArray;
        iVar17 = Vec_IntSize(vCore);
        Prf_ManGrow(pPVar24,iVar15 + iVar17);
      }
      Gia_GlaAddToAbs((Gla_Man_t *)vPPis,vCore,1);
      Gia_GlaAddOneSlice((Gla_Man_t *)vPPis,iPrev,vCore);
      Vec_IntFree(vCore);
      pVVar22 = vPPis;
      if (*(int *)(*(long *)(vPPis + 1) + 0x70) != 0) {
        iVar17 = iPrev + 1;
        iVar18 = sat_solver2_nconflicts((sat_solver2 *)vPPis[5].pArray);
        iVar15 = nConfls;
        aVar23 = Abc_Clock();
        Gla_ManAbsPrintFrame((Gla_Man_t *)pVVar22,-1,iVar17,iVar18 - iVar14,iVar15,aVar23 - aVar19);
      }
      nConfls = nConfls + 1;
    } while( true );
  }
  goto LAB_00734832;
code_r0x007341f0:
  Prf_ManStopP((Prf_Man_t **)(vPPis[5].pArray + 0x7a));
  _i = *(Abc_Cex_t **)(vPPis->pArray + 0x54);
  piVar6 = vPPis->pArray;
  piVar6[0x54] = 0;
  piVar6[0x55] = 0;
LAB_007344b9:
  if (_i != (Abc_Cex_t *)0x0) goto LAB_00734832;
  if (nCoreSize != 1) {
    __assert_fail("Status == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x712,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  RetValue = 1;
  if (pCex != (Abc_Cex_t *)0x0) {
    iVar15 = Vec_IntSize((Vec_Int_t *)pCex);
    RetValue = iVar15 + 1;
    Gia_GlaAddToCounters((Gla_Man_t *)vPPis,(Vec_Int_t *)pCex);
  }
  if (nConfls == 0) {
    *(int *)(*(long *)(vPPis + 1) + 0x80) = *(int *)(*(long *)(vPPis + 1) + 0x80) + 1;
    Vec_IntFreeP((Vec_Int_t **)&pCex);
  }
  else {
    *(undefined4 *)(*(long *)(vPPis + 1) + 0x80) = 0;
    sat_solver2_rollback((sat_solver2 *)vPPis[5].pArray);
    Gla_ManRollBack((Gla_Man_t *)vPPis);
    *(int *)&vPPis[4].pArray = fOneIsSent;
    Gia_GlaAddToAbs((Gla_Man_t *)vPPis,(Vec_Int_t *)pCex,0);
    Gia_GlaAddOneSlice((Gla_Man_t *)vPPis,iPrev,(Vec_Int_t *)pCex);
    Vec_IntFree((Vec_Int_t *)pCex);
    aVar23 = Abc_Clock();
    pCex = (Abc_Cex_t *)
           Gla_ManUnsatCore((Gla_Man_t *)vPPis,iPrev,(sat_solver2 *)vPPis[5].pArray,
                            pAStack_20->nConfLimit,*(int *)(*(long *)(vPPis + 1) + 0x70),&nCoreSize,
                            &nVarsOld);
    aVar26 = Abc_Clock();
    vPPis[0xb].pArray = (int *)((aVar26 - aVar23) + (long)vPPis[0xb].pArray);
    Vec_IntFreeP((Vec_Int_t **)&pCex);
    if (nCoreSize == -1) goto LAB_00734832;
    if (nCoreSize == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x738,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
    }
  }
  pVVar22 = vPPis;
  if (*(int *)(*(long *)(vPPis + 1) + 0x70) != 0) {
    iVar17 = iPrev + 1;
    iVar18 = sat_solver2_nconflicts((sat_solver2 *)vPPis[5].pArray);
    iVar15 = nConfls;
    aVar23 = Abc_Clock();
    Gla_ManAbsPrintFrame
              ((Gla_Man_t *)pVVar22,RetValue,iVar17,iVar18 - iVar14,iVar15,aVar23 - aVar19);
  }
  if (((2 < iPrev) && (0 < Status)) && (nConfls == 0)) {
    iVar14 = Abc_FrameIsBridgeMode();
    if (iVar14 != 0) {
      if (bVar13) {
        Gia_GlaSendCancel((Gla_Man_t *)vPPis,pAStack_20->fVerbose);
      }
      Gia_GlaSendAbsracted((Gla_Man_t *)vPPis,pAStack_20->fVerbose);
      bVar13 = true;
    }
    if (*(int *)(*(long *)(vPPis + 1) + 0x54) != 0) {
      Abc_FrameSetStatus(-1);
      Abc_FrameSetCex((Abc_Cex_t *)0x0);
      Abc_FrameSetNFrames(iPrev + 1);
      if (*(long *)(*(long *)(vPPis + 1) + 0x68) == 0) {
        local_518 = "glabs.aig";
      }
      else {
        local_518 = *(char **)(*(long *)(vPPis + 1) + 0x68);
      }
      pcVar25 = Extra_FileNameGenericAppend(local_518,".status");
      sprintf(local_488,"write_status %s",pcVar25);
      pAbc = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAbc,local_488);
      Gia_GlaDumpAbsracted((Gla_Man_t *)vPPis,pAStack_20->fVerbose);
    }
  }
  iVar14 = Gia_GlaAbsCount((Gla_Man_t *)vPPis,0,0);
  if (((*(int *)&vPPis[3].pArray + -1) * (100 - pAStack_20->nRatioMin)) / 100 <= iVar14) {
    nCoreSize = -1;
LAB_00734832:
    if (_i == (Abc_Cex_t *)0x0) {
      if ((*(int *)(*(long *)(vPPis + 1) + 0x70) != 0) && (nCoreSize == -1)) {
        printf("\n");
      }
      Vec_IntFreeP((Vec_Int_t **)&pPars_local[2].fVerbose);
      pVVar22 = Gla_ManTranslate((Gla_Man_t *)vPPis);
      *(Vec_Int_t **)&pPars_local[2].fVerbose = pVVar22;
      if (nCoreSize == -1) {
        if ((*(int *)(*(long *)(vPPis + 1) + 0x20) == 0) ||
           (aVar23 = Abc_Clock(), aVar23 < *(long *)(vPPis[5].pArray + 0x98))) {
          if ((pAStack_20->nConfLimit == 0) ||
             (iVar14 = sat_solver2_nconflicts((sat_solver2 *)vPPis[5].pArray),
             iVar14 < pAStack_20->nConfLimit)) {
            iVar14 = Gia_GlaAbsCount((Gla_Man_t *)vPPis,0,0);
            if (iVar14 < ((*(int *)&vPPis[3].pArray + -1) * (100 - pAStack_20->nRatioMin)) / 100) {
              Abc_Print(1,"Abstraction stopped for unknown reason in frame %d.  ",(ulong)(uint)iPrev
                       );
            }
            else {
              Abc_Print(1,"The ratio of abstracted objects is less than %d %% in frame %d.  ",
                        (ulong)(uint)pAStack_20->nRatioMin,(ulong)(uint)iPrev);
            }
          }
          else {
            Abc_Print(1,"Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ",
                      (ulong)(uint)pAStack_20->nConfLimit,(ulong)(uint)iPrev,
                      (ulong)*(uint *)(*(long *)(vPPis + 1) + 0x80));
          }
        }
        else {
          Abc_Print(1,"Timeout %d sec in frame %d with a %d-stable abstraction.    ",
                    (ulong)*(uint *)(*(long *)(vPPis + 1) + 0x20),(ulong)(uint)iPrev,
                    (ulong)*(uint *)(*(long *)(vPPis + 1) + 0x80));
        }
      }
      else {
        *(int *)(*(long *)(vPPis + 1) + 0x78) = *(int *)(*(long *)(vPPis + 1) + 0x78) + 1;
        Abc_Print(1,"GLA completed %d frames with a %d-stable abstraction.  ",(ulong)(uint)iPrev,
                  (ulong)*(uint *)(*(long *)(vPPis + 1) + 0x80));
      }
    }
    else {
      if (*(int *)(*(long *)(vPPis + 1) + 0x70) != 0) {
        printf("\n");
      }
      lVar5._0_4_ = pPars_local[2].fNewRefine;
      lVar5._4_4_ = pPars_local[2].fUseSkip;
      if (lVar5 != 0) {
        free(*(void **)&pPars_local[2].fNewRefine);
        pPars_local[2].fNewRefine = 0;
        pPars_local[2].fUseSkip = 0;
      }
      *(Abc_Cex_t **)&pPars_local[2].fNewRefine = _i;
      iVar14 = Gia_ManVerifyCex((Gia_Man_t *)pPars_local,_i,0);
      if (iVar14 == 0) {
        Abc_Print(1,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
      }
      Abc_Print(1,"Counter-example detected in frame %d.  ",(ulong)(uint)iPrev);
      *(int *)(*(long *)(vPPis + 1) + 0x78) = _i->iFrame + -1;
      Vec_IntFreeP((Vec_Int_t **)&pPars_local[2].fVerbose);
      clk2._4_4_ = 0;
    }
    aVar23 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar23 - aVar19);
    if (*(int *)(*(long *)(vPPis + 1) + 0x70) != 0) {
      aVar23 = Abc_Clock();
      vPPis[0xc].pArray =
           (int *)(((((aVar23 - aVar19) - (long)vPPis[0xb].pArray) - *(long *)(vPPis + 0xb)) -
                   *(long *)(vPPis + 0xc)) - (long)vPPis[10].pArray);
      Abc_Print(1,"%s =","Runtime: Initializing");
      piVar6 = vPPis[10].pArray;
      aVar23 = Abc_Clock();
      if (aVar23 == aVar19) {
        local_530 = 0.0;
      }
      else {
        piVar7 = vPPis[10].pArray;
        aVar23 = Abc_Clock();
        local_530 = ((double)(long)piVar7 * 100.0) / (double)(aVar23 - aVar19);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(long)piVar6 * 1.0) / 1000000.0,local_530);
      Abc_Print(1,"%s =","Runtime: Solver UNSAT");
      piVar6 = vPPis[0xb].pArray;
      aVar23 = Abc_Clock();
      if (aVar23 == aVar19) {
        local_548 = 0.0;
      }
      else {
        piVar7 = vPPis[0xb].pArray;
        aVar23 = Abc_Clock();
        local_548 = ((double)(long)piVar7 * 100.0) / (double)(aVar23 - aVar19);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(long)piVar6 * 1.0) / 1000000.0,local_548);
      Abc_Print(1,"%s =","Runtime: Solver SAT  ");
      lVar8._0_4_ = vPPis[0xb].nCap;
      lVar8._4_4_ = vPPis[0xb].nSize;
      aVar23 = Abc_Clock();
      if (aVar23 == aVar19) {
        local_560 = 0.0;
      }
      else {
        lVar9._0_4_ = vPPis[0xb].nCap;
        lVar9._4_4_ = vPPis[0xb].nSize;
        aVar23 = Abc_Clock();
        local_560 = ((double)lVar9 * 100.0) / (double)(aVar23 - aVar19);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar8 * 1.0) / 1000000.0,local_560);
      Abc_Print(1,"%s =","Runtime: Refinement  ");
      lVar10._0_4_ = vPPis[0xc].nCap;
      lVar10._4_4_ = vPPis[0xc].nSize;
      aVar23 = Abc_Clock();
      if (aVar23 == aVar19) {
        local_578 = 0.0;
      }
      else {
        lVar11._0_4_ = vPPis[0xc].nCap;
        lVar11._4_4_ = vPPis[0xc].nSize;
        aVar23 = Abc_Clock();
        local_578 = ((double)lVar11 * 100.0) / (double)(aVar23 - aVar19);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar10 * 1.0) / 1000000.0,local_578);
      Abc_Print(1,"%s =","Runtime: Other       ");
      piVar6 = vPPis[0xc].pArray;
      aVar23 = Abc_Clock();
      if (aVar23 == aVar19) {
        local_590 = 0.0;
      }
      else {
        piVar7 = vPPis[0xc].pArray;
        aVar23 = Abc_Clock();
        local_590 = ((double)(long)piVar7 * 100.0) / (double)(aVar23 - aVar19);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(long)piVar6 * 1.0) / 1000000.0,local_590);
      Abc_Print(1,"%s =","Runtime: TOTAL       ");
      aVar23 = Abc_Clock();
      aVar26 = Abc_Clock();
      if (aVar26 == aVar19) {
        local_5a8 = 0.0;
      }
      else {
        aVar26 = Abc_Clock();
        aVar27 = Abc_Clock();
        local_5a8 = ((double)(aVar26 - aVar19) * 100.0) / (double)(aVar27 - aVar19);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(aVar23 - aVar19) * 1.0) / 1000000.0,local_5a8);
      Gla_ManReportMemory((Gla_Man_t *)vPPis);
    }
    Gla_ManStop((Gla_Man_t *)vPPis);
    fflush(_stdout);
    return clk2._4_4_;
  }
  iPrev = iPrev + 1;
  goto LAB_0073400d;
}

Assistant:

int Gia_ManPerformGlaOld( Gia_Man_t * pAig, Abs_Par_t * pPars, int fStartVta )
{
    extern int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars );
    extern void Ga2_ManDumpStats( Gia_Man_t * pGia, Abs_Par_t * pPars, sat_solver2 * pSat, int iFrame, int fUseN );
    Gla_Man_t * p;
    Vec_Int_t * vPPis, * vCore;//, * vCore2 = NULL;
    Abc_Cex_t * pCex = NULL;
    int f, i, iPrev, nConfls, Status, nVarsOld = 0, nCoreSize, fOneIsSent = 0, RetValue = -1;
    abctime clk2, clk = Abc_Clock();
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vGateClasses == NULL )
    {
        if ( fStartVta )
        {
            int nFramesMaxOld   = pPars->nFramesMax;
            int nFramesStartOld = pPars->nFramesStart;
            int nTimeOutOld     = pPars->nTimeOut;
            int nDumpOld        = pPars->fDumpVabs;
            pPars->nFramesMax   = pPars->nFramesStart;
            pPars->nFramesStart = Abc_MinInt( pPars->nFramesStart/2 + 1, 3 );
            pPars->nTimeOut     = 20;
            pPars->fDumpVabs    = 0;
            RetValue = Gia_VtaPerformInt( pAig, pPars );
            pPars->nFramesMax   = nFramesMaxOld;
            pPars->nFramesStart = nFramesStartOld;
            pPars->nTimeOut     = nTimeOutOld;
            pPars->fDumpVabs    = nDumpOld;
            // create gate classes
            Vec_IntFreeP( &pAig->vGateClasses );
            if ( pAig->vObjClasses )
                pAig->vGateClasses = Gia_VtaConvertToGla( pAig, pAig->vObjClasses );
            Vec_IntFreeP( &pAig->vObjClasses );
            // return if VTA solve the problem if could not start
            if ( RetValue == 0 || pAig->vGateClasses == NULL )
                return RetValue;
        }
        else
        {
            pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
            Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
            Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
        }
    }
    // start the manager
    p = Gla_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    for ( f = i = iPrev = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++, iPrev = i )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;

        // load timeframe
        Gia_GlaAddTimeFrame( p, f );

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
//            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 || (p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit) ) // resource limit is reached
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
//                if ( Gia_ManRegNum(p->pGia) > 1 ) // for comb cases, return the abstraction
//                    Vec_IntShrink( p->vAbs, p->nAbsOld );
                goto finish;
            }
            if ( Status == 1 )
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            } 
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;

            // cancel old one if it was sent
            if ( Abc_FrameIsBridgeMode() && fOneIsSent )
            {
                Gia_GlaSendCancel( p, pPars->fVerbose );
                fOneIsSent = 0;
            }

            // perform the refinement
            clk2 = Abc_Clock();
            if ( pPars->fAddLayer )
            {
                vPPis = Gla_ManCollectPPis( p, NULL );
//                Gla_ManExplorePPis( p, vPPis );
            }
            else
            {
                vPPis = Gla_ManRefinement( p );
                if ( vPPis == NULL )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    pCex = p->pGia->pCexSeq; p->pGia->pCexSeq = NULL;
                    break;
                }
            } 
            assert( pCex == NULL );

            // start proof logging
            if ( i == 0 )
            {
                // create bookmark to be used for rollback
                sat_solver2_bookmark( p->pSat );
                Vec_IntClear( p->vAddedNew );
                p->nAbsOld = Vec_IntSize( p->vAbs );
                nVarsOld = p->nSatVars;
//                p->nLrnOld = sat_solver2_nlearnts( p->pSat );
//                p->nAbsNew = 0;
//                p->nLrnNew = 0;

                // start incremental proof manager
                assert( p->pSat->pPrf2 == NULL );
                if ( p->pSat->pPrf1 == NULL )
                    p->pSat->pPrf2 = Prf_ManAlloc();
                if ( p->pSat->pPrf2 )
                {
                    p->nProofIds = 0;
                    Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                    Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                }
            }
            else
            {
                // resize the proof logger
                if ( p->pSat->pPrf2 )
                    Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
            }

            Gia_GlaAddToAbs( p, vPPis, 1 );
            Gia_GlaAddOneSlice( p, f, vPPis );
            Vec_IntFree( vPPis );

            // print the result (do not count it towards change)
            if ( p->pPars->fVerbose )
            Gla_ManAbsPrintFrame( p, -1, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );
        }
        if ( pCex != NULL )
            break;
        assert( Status == 1 );

        // valid core is obtained
        nCoreSize = 1;
        if ( vCore )
        {
            nCoreSize += Vec_IntSize( vCore );
            Gia_GlaAddToCounters( p, vCore );
        }
        if ( i == 0 )
        {
            p->pPars->nFramesNoChange++;
            Vec_IntFreeP( &vCore );
        }
        else
        {
            p->pPars->nFramesNoChange = 0;
//            p->nAbsNew = Vec_IntSize( p->vAbs ) - p->nAbsOld;
//            p->nLrnNew = Abc_AbsInt( sat_solver2_nlearnts( p->pSat ) - p->nLrnOld );
            // update the SAT solver
            sat_solver2_rollback( p->pSat );
            // update storage
            Gla_ManRollBack( p );
            p->nSatVars = nVarsOld;
            // load this timeframe
            Gia_GlaAddToAbs( p, vCore, 0 );
            Gia_GlaAddOneSlice( p, f, vCore );
            Vec_IntFree( vCore );
            // run SAT solver
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
            p->timeUnsat += Abc_Clock() - clk2;
//            assert( (vCore != NULL) == (Status == 1) );
            Vec_IntFreeP( &vCore );
            if ( Status == -1 ) // resource limit is reached
                break;
            if ( Status == 0 )
            {
                assert( 0 );
    //            Vta_ManSatVerify( p );
                // make sure, there was no initial abstraction (otherwise, it was invalid)
                assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
    //            pCex = Vga_ManDeriveCex( p );
                break;
            }
        }
        // print the result
        if ( p->pPars->fVerbose )
        Gla_ManAbsPrintFrame( p, nCoreSize, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );

        if ( f > 2 && iPrev > 0 && i == 0 ) // change has happened
        {
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_GlaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_GlaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }

            // dump the model into file
            if ( p->pPars->fDumpVabs )
            {
                char Command[1000];
                Abc_FrameSetStatus( -1 );
                Abc_FrameSetCex( NULL );
                Abc_FrameSetNFrames( f+1 );
                sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status") );
                Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                Gia_GlaDumpAbsracted( p, pPars->fVerbose );
            }
        }

        // check if the number of objects is below limit
        if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
//        if ( pAig->vGateClasses != NULL )
//            Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Gla_ManTranslate( p );
        if ( Status == -1 )
        {
            if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
            else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
            else if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
                Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
            else
                Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
        }
        else
        {
            p->pPars->iFrame++;
            Abc_Print( 1, "GLA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( pAig, pCex, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gla_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( pAig, p->pPars, p->pSat, p->pPars->iFrame, 1 );
    Gla_ManStop( p );
    fflush( stdout );
    return RetValue;
}